

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_u32string_equal_real(void)

{
  undefined1 local_ac9;
  basic_variable<std::allocator<char>_> local_ac8;
  basic_variable<std::allocator<char>_> local_a98;
  undefined1 local_a5b [2];
  undefined1 local_a59;
  basic_variable<std::allocator<char>_> local_a58;
  basic_variable<std::allocator<char>_> local_a28;
  undefined1 local_9eb [2];
  undefined1 local_9e9;
  basic_variable<std::allocator<char>_> local_9e8;
  basic_variable<std::allocator<char>_> local_9b8;
  undefined1 local_97b [2];
  undefined1 local_979;
  basic_variable<std::allocator<char>_> local_978;
  basic_variable<std::allocator<char>_> local_948;
  undefined1 local_90b [2];
  undefined1 local_909;
  basic_variable<std::allocator<char>_> local_908;
  basic_variable<std::allocator<char>_> local_8d8;
  undefined1 local_89b [2];
  undefined1 local_899;
  basic_variable<std::allocator<char>_> local_898;
  basic_variable<std::allocator<char>_> local_868;
  undefined1 local_82b [2];
  undefined1 local_829;
  basic_variable<std::allocator<char>_> local_828;
  basic_variable<std::allocator<char>_> local_7f8;
  undefined1 local_7bb [2];
  undefined1 local_7b9;
  basic_variable<std::allocator<char>_> local_7b8;
  basic_variable<std::allocator<char>_> local_788;
  undefined1 local_74a [10];
  longdouble big_2;
  longdouble zero_2;
  undefined1 local_719;
  basic_variable<std::allocator<char>_> local_718;
  basic_variable<std::allocator<char>_> local_6e8;
  undefined1 local_6ab [2];
  undefined1 local_6a9;
  basic_variable<std::allocator<char>_> local_6a8;
  basic_variable<std::allocator<char>_> local_678;
  undefined1 local_63b [2];
  undefined1 local_639;
  basic_variable<std::allocator<char>_> local_638;
  basic_variable<std::allocator<char>_> local_608;
  undefined1 local_5cb [2];
  undefined1 local_5c9;
  basic_variable<std::allocator<char>_> local_5c8;
  basic_variable<std::allocator<char>_> local_598;
  undefined1 local_55b [2];
  undefined1 local_559;
  basic_variable<std::allocator<char>_> local_558;
  basic_variable<std::allocator<char>_> local_528;
  undefined1 local_4eb [2];
  undefined1 local_4e9;
  basic_variable<std::allocator<char>_> local_4e8;
  basic_variable<std::allocator<char>_> local_4b8;
  undefined1 local_47b [2];
  undefined1 local_479;
  basic_variable<std::allocator<char>_> local_478;
  basic_variable<std::allocator<char>_> local_448;
  undefined1 local_40b [2];
  undefined1 local_409;
  basic_variable<std::allocator<char>_> local_408;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_3a2 [2];
  double local_3a0;
  double big_1;
  double zero_1;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  float local_10;
  undefined4 local_c;
  float big;
  float zero;
  
  local_c = 0;
  local_10 = std::numeric_limits<float>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_78,0.0);
  local_12[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb65,"void equality_suite::compare_u32string_equal_real()",local_12,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_e8,0.0);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb66,"void equality_suite::compare_u32string_equal_real()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_158,3.4028235e+38);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb67,"void equality_suite::compare_u32string_equal_real()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_1c8,3.4028235e+38);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb68,"void equality_suite::compare_u32string_equal_real()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_238,0.0);
  local_1cb[0] = trial::dynamic::operator==(&local_208,&local_238);
  local_239 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb6a,"void equality_suite::compare_u32string_equal_real()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_2a8,0.0);
  local_23b[0] = trial::dynamic::operator!=(&local_278,&local_2a8);
  local_2a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb6b,"void equality_suite::compare_u32string_equal_real()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_318,3.4028235e+38);
  local_2ab[0] = trial::dynamic::operator==(&local_2e8,&local_318);
  local_319 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb6c,"void equality_suite::compare_u32string_equal_real()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_388,3.4028235e+38);
  local_31b[0] = trial::dynamic::operator!=(&local_358,&local_388);
  zero_1._7_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb6d,"void equality_suite::compare_u32string_equal_real()",local_31b,
             (long)&zero_1 + 7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  big_1 = 0.0;
  local_3a0 = std::numeric_limits<double>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3d8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_408,0.0);
  local_3a2[0] = trial::dynamic::operator==(&local_3d8,&local_408);
  local_409 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb74,"void equality_suite::compare_u32string_equal_real()",local_3a2,&local_409);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_448,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_478,0.0);
  local_40b[0] = trial::dynamic::operator!=(&local_448,&local_478);
  local_479 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb75,"void equality_suite::compare_u32string_equal_real()",local_40b,&local_479);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_478);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_448);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4b8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_4e8,1.79769313486232e+308);
  local_47b[0] = trial::dynamic::operator==(&local_4b8,&local_4e8);
  local_4e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb76,"void equality_suite::compare_u32string_equal_real()",local_47b,&local_4e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_528,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_558,1.79769313486232e+308);
  local_4eb[0] = trial::dynamic::operator!=(&local_528,&local_558);
  local_559 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb77,"void equality_suite::compare_u32string_equal_real()",local_4eb,&local_559);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_598,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_5c8,0.0);
  local_55b[0] = trial::dynamic::operator==(&local_598,&local_5c8);
  local_5c9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb79,"void equality_suite::compare_u32string_equal_real()",local_55b,&local_5c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_608,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_638,0.0);
  local_5cb[0] = trial::dynamic::operator!=(&local_608,&local_638);
  local_639 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb7a,"void equality_suite::compare_u32string_equal_real()",local_5cb,&local_639);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_638);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_608);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_678,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_6a8,1.79769313486232e+308);
  local_63b[0] = trial::dynamic::operator==(&local_678,&local_6a8);
  local_6a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb7b,"void equality_suite::compare_u32string_equal_real()",local_63b,&local_6a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_678);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6e8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_718,1.79769313486232e+308);
  local_6ab[0] = trial::dynamic::operator!=(&local_6e8,&local_718);
  local_719 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb7c,"void equality_suite::compare_u32string_equal_real()",local_6ab,&local_719);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6e8);
  unique0x10001603 = (longdouble)0;
  std::numeric_limits<long_double>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_788,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_7b8,(longdouble)0);
  local_74a[0] = trial::dynamic::operator==(&local_788,&local_7b8);
  local_7b9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb83,"void equality_suite::compare_u32string_equal_real()",local_74a,&local_7b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_788);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7f8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_828,(longdouble)0);
  local_7bb[0] = trial::dynamic::operator!=(&local_7f8,&local_828);
  local_829 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb84,"void equality_suite::compare_u32string_equal_real()",local_7bb,&local_829);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_868,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_898,_DAT_00223040);
  local_82b[0] = trial::dynamic::operator==(&local_868,&local_898);
  local_899 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb85,"void equality_suite::compare_u32string_equal_real()",local_82b,&local_899);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_898);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_868);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_8d8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_908,_DAT_00223040);
  local_89b[0] = trial::dynamic::operator!=(&local_8d8,&local_908);
  local_909 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb86,"void equality_suite::compare_u32string_equal_real()",local_89b,&local_909);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_948,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_978,(longdouble)0);
  local_90b[0] = trial::dynamic::operator==(&local_948,&local_978);
  local_979 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb88,"void equality_suite::compare_u32string_equal_real()",local_90b,&local_979);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_9b8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_9e8,(longdouble)0);
  local_97b[0] = trial::dynamic::operator!=(&local_9b8,&local_9e8);
  local_9e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb89,"void equality_suite::compare_u32string_equal_real()",local_97b,&local_9e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a28,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_a58,_DAT_00223040);
  local_9eb[0] = trial::dynamic::operator==(&local_a28,&local_a58);
  local_a59 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb8a,"void equality_suite::compare_u32string_equal_real()",local_9eb,&local_a59);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a58);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a98,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_ac8,_DAT_00223040);
  local_a5b[0] = trial::dynamic::operator!=(&local_a98,&local_ac8);
  local_ac9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xb8b,"void equality_suite::compare_u32string_equal_real()",local_a5b,&local_ac9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a98);
  return;
}

Assistant:

void compare_u32string_equal_real()
{
    // u32string - float
    {
        const auto zero = 0.0f;
        const auto big = std::numeric_limits<float>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != variable(big), true);
    }
    // u32string - double
    {
        const auto zero = 0.0;
        const auto big = std::numeric_limits<double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != variable(big), true);
    }
    // u32string - long double
    {
        const auto zero = 0.0L;
        const auto big = std::numeric_limits<long double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != variable(big), true);
    }
}